

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

int CVmFormatter::wtoi(wchar_t *p)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  
  do {
    pwVar4 = p;
    iVar3 = t3_is_whitespace(*pwVar4);
    p = pwVar4 + 1;
  } while (iVar3 != 0);
  pwVar5 = p;
  if ((*pwVar4 == L'+') || (pwVar5 = pwVar4, *pwVar4 != L'-')) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    pwVar5 = p;
  }
  iVar3 = 0;
  for (; (uint)(*pwVar5 + L'\xffffffd0') < 10; pwVar5 = pwVar5 + 1) {
    iVar3 = *pwVar5 + L'\xffffffd0' + iVar3 * 10;
  }
  iVar1 = -iVar3;
  if (bVar2) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int CVmFormatter::wtoi(const wchar_t *p)
{
    long acc;
    int neg = FALSE;

    /* skip any leading whitespace */
    while (t3_is_whitespace(*p))
        ++p;

    /* check for a leading sign */
    if (*p == '+')
    {
        /* positive sign - skip it */
        ++p;
    }
    else if (*p == '-')
    {
        /* negative sign - note it and skip it */
        neg = TRUE;
        ++p;
    }

    /* scan the digits */
    for (acc = 0 ; is_digit(*p) ; ++p)
    {
        /* shift the accumulator and add this digit */
        acc *= 10;
        acc += value_of_digit(*p);
    }

    /* apply the sign */
    if (neg)
        acc = -acc;

    /* return the result */
    return acc;
}